

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68040_move16_al_pi(m68k_info *info)

{
  long in_RDI;
  int modes [2];
  int data [2];
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  read_imm_32((m68k_info *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  if ((*(uint *)(in_RDI + 0x28) & 0x10) == 0) {
    d68000_invalid((m68k_info *)0x387b4b);
  }
  else {
    build_move16(info,(int *)data,(int *)modes);
  }
  return;
}

Assistant:

static void d68040_move16_al_pi(m68k_info *info)
{
	int data[] = { read_imm_32(info), info->ir & 7 };
	int modes[] = { M68K_AM_ABSOLUTE_DATA_LONG, M68K_AM_REGI_ADDR_POST_INC };

	LIMIT_CPU_TYPES(info, M68040_PLUS);

	build_move16(info, data, modes);
}